

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O1

void gimage::drawLine<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long x1,long y1,
               long x2,long y2,float r,float g,float b)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  uchar local_2b [3];
  uchar v [3];
  
  local_2b[0] = (uchar)(int)r;
  local_2b[1] = (char)(int)(float)(~-(uint)(g < 0.0) & (uint)g | -(uint)(g < 0.0) & (uint)r);
  local_2b[2] = (char)(int)(float)(~-(uint)(b < 0.0) & (uint)b | -(uint)(b < 0.0) & (uint)r);
  uVar1 = image->depth;
  uVar2 = 3;
  if ((int)uVar1 < 3) {
    uVar2 = uVar1;
  }
  uVar8 = x2 - x1;
  uVar9 = y2 - y1;
  if (uVar8 == 0 && uVar9 == 0) {
    if ((0 < (int)uVar1 && y1 < image->height) && (x1 < image->width && -1 < (y1 | x1))) {
      uVar8 = 0;
      do {
        image->img[uVar8][y1][x1] = local_2b[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  else {
    uVar5 = -uVar8;
    uVar12 = uVar8;
    if ((long)uVar8 < 1) {
      uVar12 = uVar5;
    }
    uVar11 = -uVar9;
    uVar10 = uVar9;
    if ((long)uVar9 < 1) {
      uVar10 = uVar11;
    }
    if (uVar10 < uVar12) {
      lVar4 = x1;
      if ((long)uVar8 < 0) {
        uVar8 = -uVar8;
        uVar9 = -uVar9;
        lVar4 = x2;
        y1 = y2;
        x2 = x1;
      }
      lVar7 = 0;
      if (0 < lVar4) {
        lVar7 = lVar4;
      }
      lVar6 = image->width + -1;
      if (x2 < image->width) {
        lVar6 = x2;
      }
      if (lVar7 <= lVar6) {
        do {
          lVar3 = (long)((lVar7 - lVar4) * uVar9) / (long)uVar8 + y1;
          if ((-1 < lVar3 && 0 < (int)uVar1) && lVar3 < image->height) {
            uVar5 = 0;
            do {
              image->img[uVar5][lVar3][lVar7] = local_2b[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          bVar13 = lVar7 != lVar6;
          lVar7 = lVar7 + 1;
        } while (bVar13);
      }
    }
    else {
      lVar4 = y1;
      if (-1 < (long)uVar9) {
        x2 = x1;
        lVar4 = y2;
        uVar5 = uVar8;
        y2 = y1;
        uVar11 = uVar9;
      }
      lVar7 = 0;
      if (0 < y2) {
        lVar7 = y2;
      }
      lVar6 = image->height + -1;
      if (lVar4 < image->height) {
        lVar6 = lVar4;
      }
      if (lVar7 <= lVar6) {
        do {
          lVar4 = (long)((lVar7 - y2) * uVar5) / (long)uVar11 + x2;
          if ((-1 < lVar4 && 0 < (int)uVar1) && lVar4 < image->width) {
            uVar8 = 0;
            do {
              image->img[uVar8][lVar7][lVar4] = local_2b[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          bVar13 = lVar7 != lVar6;
          lVar7 = lVar7 + 1;
        } while (bVar13);
      }
    }
  }
  return;
}

Assistant:

void drawLine(Image<T> &image, long x1, long y1, long x2,
                                long y2, float r, float g=-1, float b=-1)
{
  T v[3];

  if (g < 0)
  {
    g=r;
  }

  if (b < 0)
  {
    b=r;
  }

  v[0]=static_cast<T>(r);
  v[1]=static_cast<T>(g);
  v[2]=static_cast<T>(b);

  int cn=std::min(3, image.getDepth());

  long dx=x2-x1;
  long dy=y2-y1;

  if (dx != 0 || dy != 0)
  {
    long adx=std::abs(dx);
    long ady=std::abs(dy);

    if (adx > ady)
    {
      long i, n;

      if (dx >= 0)
      {
        i=x1;
        n=x2;
      }
      else
      {
        i=x2;
        n=x1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (i < 0)
      {
        i=0;
      }

      if (n > image.getWidth()-1)
      {
        n=image.getWidth()-1;
      }

      while (i <= n)
      {
        long k=y1+(i-x1)*dy/dx;

        if (k >= 0 && k < image.getHeight())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        i++;
      }
    }
    else
    {
      long k, n;

      if (dy >= 0)
      {
        k=y1;
        n=y2;
      }
      else
      {
        k=y2;
        n=y1;
        dx=-dx;
        dy=-dy;
        x1=x2;
        y1=y2;
      }

      if (k < 0)
      {
        k=0;
      }

      if (n > image.getHeight()-1)
      {
        n=image.getHeight()-1;
      }

      while (k <= n)
      {
        long i=x1+(k-y1)*dx/dy;

        if (i >= 0 && i < image.getWidth())
        {
          for (int c=0; c<cn; c++)
          {
            image.set(i, k, c, v[c]);
          }
        }

        k++;
      }
    }
  }
  else
  {
    if (x1 >= 0 && y1 >= 0 && x1 < image.getWidth() && y1 < image.getHeight())
    {
      for (int c=0; c<cn; c++)
      {
        image.set(x1, y1, c, v[c]);
      }
    }
  }
}